

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O0

void nn_atcp_term(nn_atcp *self)

{
  nn_atcp *self_local;
  
  if (self->state != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
            "NN_ATCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
            ,0x43);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_item_term(&self->item);
  nn_fsm_event_term(&self->done);
  nn_fsm_event_term(&self->accepted);
  nn_stcp_term(&self->stcp);
  nn_usock_term(&self->usock);
  nn_fsm_term(&self->fsm);
  return;
}

Assistant:

void nn_atcp_term (struct nn_atcp *self)
{
    nn_assert_state (self, NN_ATCP_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_stcp_term (&self->stcp);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}